

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O0

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftDown_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  int iVar1;
  uint local_24;
  uint32_t min_child_index;
  Timer *e_local;
  uint32_t hole_index_local;
  MinHeap<sznet::Timer> *this_local;
  
  local_24 = rightChild(this,hole_index);
  e_local._4_4_ = hole_index;
  for (; local_24 <= this->m_size; local_24 = rightChild(this,local_24)) {
    if ((local_24 == this->m_size) ||
       (iVar1 = (*this->m_pCmpFunc)(this->m_ptrArr[local_24],this->m_ptrArr[local_24 - 1]),
       iVar1 == 1)) {
      local_24 = local_24 - 1;
    }
    iVar1 = (*this->m_pCmpFunc)(e,this->m_ptrArr[local_24]);
    if (iVar1 == -1) break;
    this->m_ptrArr[e_local._4_4_] = this->m_ptrArr[local_24];
    (this->m_ptrArr[e_local._4_4_]->super_MinHeaBaseElem).min_heap_idx = e_local._4_4_;
    e_local._4_4_ = local_24;
  }
  this->m_ptrArr[e_local._4_4_] = e;
  (this->m_ptrArr[e_local._4_4_]->super_MinHeaBaseElem).min_heap_idx = e_local._4_4_;
  return;
}

Assistant:

void shiftDown_(uint32_t hole_index, T* e)
	{
		// 用于记录值较小的子结点的下标
		uint32_t min_child_index = rightChild(hole_index);
		// min_child_index小于m_size的情况说明有左孩子也有右孩子
		// min_child_index等于m_size的情况说明只有左孩子没有右孩子
		// min_child_index大于m_size的情况说明没有左孩子也没有右孩子
		while (min_child_index <= m_size)
		{
			// 没有右孩子 或者 左孩子小于右孩子
			if (min_child_index == m_size || m_pCmpFunc(m_ptrArr[min_child_index], m_ptrArr[min_child_index - 1]) == 1)
			{
				--min_child_index;
			}
			// 如果待放入的节点e比删除节点的左右孩子中较小的还小，符合性质，结束
			if (m_pCmpFunc(e, m_ptrArr[min_child_index]) == -1)
			{
				break;
			}
			// 继续向下找合适的位置
			m_ptrArr[hole_index] = m_ptrArr[min_child_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = min_child_index;
			min_child_index = rightChild(hole_index);
		}
		// 合适位置
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}